

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

void __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::ensure_ring
          (ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this)

{
  SignalLink *this_00;
  long *in_RDI;
  SignalLink *this_01;
  
  if (*in_RDI == 0) {
    this_00 = (SignalLink *)operator_new(0x38);
    this_01 = this_00;
    Catch::clara::std::function<void_(const_void_*)>::function
              ((function<void_(const_void_*)> *)this_00);
    SignalLink::SignalLink(this_01,(CbFunction *)this_00);
    *in_RDI = (long)this_00;
    Catch::clara::std::function<void_(const_void_*)>::~function
              ((function<void_(const_void_*)> *)0x2b13e0);
    SignalLink::incref((SignalLink *)*in_RDI);
    *(long *)*in_RDI = *in_RDI;
    *(long *)(*in_RDI + 8) = *in_RDI;
  }
  return;
}

Assistant:

void ensure_ring() {
    if (!callback_ring_) {
      callback_ring_ = new SignalLink(CbFunction());  // ref_count = 1
      callback_ring_->incref();  // ref_count = 2, head of ring, can be
                                 // deactivated but not removed
      callback_ring_->next = callback_ring_;  // ring head initialization
      callback_ring_->prev = callback_ring_;  // ring tail initialization
    }
  }